

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O0

stat_t * simdjson_computestats(string_view *p)

{
  ulong uVar1;
  byte bVar2;
  uint8_t *puVar3;
  size_type sVar4;
  size_t sVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  stat_t *in_RDI;
  size_t howmany;
  uint8_t type;
  uint64_t tape_val;
  size_t tapeidx;
  ParsedJson pj;
  undefined8 in_stack_ffffffffffffff40;
  stat_t *psVar6;
  undefined1 uStack_81;
  ulong local_80;
  ParsedJson local_68 [36];
  uint local_44;
  ulong *local_38;
  basic_string_view<char,_std::char_traits<char>_> *local_8;
  
  psVar6 = in_RDI;
  local_8 = in_RSI;
  build_parsed_json((string_view *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
  bVar2 = ParsedJson::isValid();
  psVar6->valid = (bool)(bVar2 & 1);
  if ((psVar6->valid & 1U) != 0) {
    puVar3 = (uint8_t *)std::basic_string_view<char,_std::char_traits<char>_>::data(local_8);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_8);
    sVar5 = count_backslash(puVar3,sVar4);
    psVar6->backslash_count = sVar5;
    puVar3 = (uint8_t *)std::basic_string_view<char,_std::char_traits<char>_>::data(local_8);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_8);
    sVar5 = count_nonasciibytes(puVar3,sVar4);
    psVar6->nonasciibyte_count = sVar5;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_8);
    psVar6->byte_count = sVar4;
    psVar6->integer_count = 0;
    psVar6->float_count = 0;
    psVar6->object_count = 0;
    psVar6->array_count = 0;
    psVar6->null_count = 0;
    psVar6->true_count = 0;
    psVar6->false_count = 0;
    psVar6->string_count = 0;
    psVar6->structural_indexes_count = (ulong)local_44;
    local_80 = 1;
    uVar1 = *local_38;
    if ((char)(uVar1 >> 0x38) != 'r') {
      __assert_fail("type == \'r\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/tools/jsonstats.cpp"
                    ,0x45,"stat_t simdjson_computestats(const std::string_view &)");
    }
    for (; local_80 < (uVar1 & 0xffffffffffffff); local_80 = local_80 + 1) {
      uStack_81 = (undefined1)(local_38[local_80] >> 0x38);
      switch(uStack_81) {
      case 0x22:
        psVar6->string_count = psVar6->string_count + 1;
        break;
      default:
        break;
      case 0x5b:
        psVar6->array_count = psVar6->array_count + 1;
        break;
      case 0x5d:
        break;
      case 100:
        psVar6->float_count = psVar6->float_count + 1;
        local_80 = local_80 + 1;
        break;
      case 0x66:
        psVar6->false_count = psVar6->false_count + 1;
        break;
      case 0x6c:
        psVar6->integer_count = psVar6->integer_count + 1;
        local_80 = local_80 + 1;
        break;
      case 0x6e:
        psVar6->null_count = psVar6->null_count + 1;
        break;
      case 0x74:
        psVar6->true_count = psVar6->true_count + 1;
        break;
      case 0x7b:
        psVar6->object_count = psVar6->object_count + 1;
        break;
      case 0x7d:
      }
    }
  }
  ParsedJson::~ParsedJson(local_68);
  return in_RDI;
}

Assistant:

stat_t simdjson_computestats(const std::string_view &p) {
  stat_t answer;
  ParsedJson pj = build_parsed_json(p);
  answer.valid = pj.isValid();
  if (!answer.valid) {
    return answer;
  }
  answer.backslash_count = count_backslash(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.nonasciibyte_count = count_nonasciibytes(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.byte_count = p.size();
  answer.integer_count = 0;
  answer.float_count = 0;
  answer.object_count = 0;
  answer.array_count = 0;
  answer.null_count = 0;
  answer.true_count = 0;
  answer.false_count = 0;
  answer.string_count = 0;
  answer.structural_indexes_count = pj.n_structural_indexes;
  size_t tapeidx = 0;
  uint64_t tape_val = pj.tape[tapeidx++];
  uint8_t type = (tape_val >> 56);
  size_t howmany = 0;
  assert(type == 'r');
  howmany = tape_val & JSONVALUEMASK;
  for (; tapeidx < howmany; tapeidx++) {
    tape_val = pj.tape[tapeidx];
    // uint64_t payload = tape_val & JSONVALUEMASK;
    type = (tape_val >> 56);
    switch (type) {
    case 'l': // we have a long int
      answer.integer_count++;
      tapeidx++; // skipping the integer
      break;
    case 'd': // we have a double
      answer.float_count++;
      tapeidx++; // skipping the double
      break;
    case 'n': // we have a null
      answer.null_count++;
      break;
    case 't': // we have a true
      answer.true_count++;
      break;
    case 'f': // we have a false
      answer.false_count++;
      break;
    case '{': // we have an object
      answer.object_count++;
      break;
    case '}': // we end an object
      break;
    case '[': // we start an array
      answer.array_count++;
      break;
    case ']': // we end an array
      break;
    case '"': // we have a string
      answer.string_count++;
      break;
    default:
      break; // ignore
    }
  }
  return answer;
}